

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O3

void opj_t1_decode_cblks(opj_tcd_t *tcd,OPJ_BOOL *pret,opj_tcd_tilecomp_t *tilec,opj_tccp_t *tccp,
                        opj_event_mgr_t *p_manager,opj_mutex_t *p_manager_mutex,OPJ_BOOL check_pterm
                        )

{
  opj_thread_pool_t *tp;
  opj_tcd_resolution_t *poVar1;
  opj_tcd_precinct_t *poVar2;
  opj_tcd_cblk_dec_t *poVar3;
  void *pvVar4;
  opj_tcd_cblk_enc_t *poVar5;
  uint uVar6;
  OPJ_UINT32 OVar7;
  OPJ_BOOL OVar8;
  int iVar9;
  opj_tcd_band_t *poVar10;
  OPJ_BOOL *user_data;
  uint uVar11;
  OPJ_UINT32 OVar12;
  OPJ_UINT32 resno;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  
  uVar6 = tilec->minimum_num_resolutions;
  if (uVar6 != 0) {
    tp = tcd->thread_pool;
    uVar13 = 0;
    do {
      poVar1 = tilec->resolutions;
      uVar11 = poVar1[uVar13].numbands;
      if (uVar11 != 0) {
        OVar7 = poVar1[uVar13].pw;
        OVar12 = poVar1[uVar13].ph;
        uVar15 = 0;
        do {
          if (OVar12 * OVar7 != 0) {
            poVar10 = poVar1[uVar13].bands + uVar15;
            uVar14 = 0;
            do {
              poVar2 = poVar10->precincts;
              resno = (OPJ_UINT32)uVar13;
              OVar8 = opj_tcd_is_subband_area_of_interest
                                (tcd,tilec->compno,resno,poVar10->bandno,poVar2[uVar14].x0,
                                 poVar2[uVar14].y0,poVar2[uVar14].x1,poVar2[uVar14].y1);
              OVar7 = poVar2[uVar14].cw;
              OVar12 = poVar2[uVar14].ch;
              if (OVar8 == 0) {
                if (OVar12 * OVar7 != 0) {
                  lVar16 = 0x40;
                  uVar17 = 0;
                  do {
                    poVar5 = poVar2[uVar14].cblks.enc;
                    pvVar4 = *(void **)((long)&poVar5->data + lVar16);
                    if (pvVar4 != (void *)0x0) {
                      opj_aligned_free(pvVar4);
                      *(undefined8 *)((long)&poVar5->data + lVar16) = 0;
                      OVar7 = poVar2[uVar14].cw;
                      OVar12 = poVar2[uVar14].ch;
                    }
                    uVar17 = uVar17 + 1;
                    lVar16 = lVar16 + 0x48;
                  } while (uVar17 < OVar12 * OVar7);
                }
              }
              else if (OVar12 * OVar7 != 0) {
                lVar16 = 0;
                uVar17 = 0;
                do {
                  poVar3 = poVar2[uVar14].cblks.dec;
                  OVar8 = opj_tcd_is_subband_area_of_interest
                                    (tcd,tilec->compno,resno,poVar10->bandno,
                                     *(OPJ_UINT32 *)((long)&poVar3->x0 + lVar16),
                                     *(OPJ_UINT32 *)((long)&poVar3->y0 + lVar16),
                                     *(OPJ_UINT32 *)((long)&poVar3->x1 + lVar16),
                                     *(OPJ_UINT32 *)((long)&poVar3->y1 + lVar16));
                  if (OVar8 == 0) {
                    pvVar4 = *(void **)((long)&poVar3->decoded_data + lVar16);
                    if (pvVar4 != (void *)0x0) {
                      opj_aligned_free(pvVar4);
                      *(undefined8 *)((long)&poVar3->decoded_data + lVar16) = 0;
                    }
                  }
                  else if ((tcd->whole_tile_decoding != 0) ||
                          (((*(long *)((long)&poVar3->decoded_data + lVar16) == 0 &&
                            (*(int *)((long)&poVar3->x1 + lVar16) !=
                             *(int *)((long)&poVar3->x0 + lVar16))) &&
                           (*(int *)((long)&poVar3->y1 + lVar16) !=
                            *(int *)((long)&poVar3->y0 + lVar16))))) {
                    user_data = (OPJ_BOOL *)opj_calloc(1,0x50);
                    if (user_data == (OPJ_BOOL *)0x0) {
                      *pret = 0;
                      return;
                    }
                    *user_data = tcd->whole_tile_decoding;
                    user_data[1] = resno;
                    *(long *)(user_data + 2) = (long)&poVar3->segs + lVar16;
                    *(opj_tcd_band_t **)(user_data + 4) = poVar10;
                    *(opj_tcd_tilecomp_t **)(user_data + 6) = tilec;
                    *(opj_tccp_t **)(user_data + 8) = tccp;
                    *(OPJ_BOOL **)(user_data + 0xc) = pret;
                    *(opj_mutex_t **)(user_data + 0x10) = p_manager_mutex;
                    *(opj_event_mgr_t **)(user_data + 0xe) = p_manager;
                    user_data[0x12] = check_pterm;
                    iVar9 = opj_thread_pool_get_thread_count(tp);
                    user_data[10] = (uint)(1 < iVar9);
                    opj_thread_pool_submit_job(tp,opj_t1_clbl_decode_processor,user_data);
                    if (*pret == 0) {
                      return;
                    }
                  }
                  uVar17 = uVar17 + 1;
                  lVar16 = lVar16 + 0x48;
                } while (uVar17 < poVar2[uVar14].ch * poVar2[uVar14].cw);
              }
              uVar14 = uVar14 + 1;
              OVar7 = poVar1[uVar13].pw;
              OVar12 = poVar1[uVar13].ph;
            } while (uVar14 < OVar12 * OVar7);
            uVar11 = poVar1[uVar13].numbands;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < uVar11);
        uVar6 = tilec->minimum_num_resolutions;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar6);
  }
  return;
}

Assistant:

void opj_t1_decode_cblks(opj_tcd_t* tcd,
                         volatile OPJ_BOOL* pret,
                         opj_tcd_tilecomp_t* tilec,
                         opj_tccp_t* tccp,
                         opj_event_mgr_t *p_manager,
                         opj_mutex_t* p_manager_mutex,
                         OPJ_BOOL check_pterm
                        )
{
    opj_thread_pool_t* tp = tcd->thread_pool;
    OPJ_UINT32 resno, bandno, precno, cblkno;

#ifdef DEBUG_VERBOSE
    OPJ_UINT32 codeblocks_decoded = 0;
    printf("Enter opj_t1_decode_cblks()\n");
#endif

    for (resno = 0; resno < tilec->minimum_num_resolutions; ++resno) {
        opj_tcd_resolution_t* res = &tilec->resolutions[resno];

        for (bandno = 0; bandno < res->numbands; ++bandno) {
            opj_tcd_band_t* OPJ_RESTRICT band = &res->bands[bandno];

            for (precno = 0; precno < res->pw * res->ph; ++precno) {
                opj_tcd_precinct_t* precinct = &band->precincts[precno];

                if (!opj_tcd_is_subband_area_of_interest(tcd,
                        tilec->compno,
                        resno,
                        band->bandno,
                        (OPJ_UINT32)precinct->x0,
                        (OPJ_UINT32)precinct->y0,
                        (OPJ_UINT32)precinct->x1,
                        (OPJ_UINT32)precinct->y1)) {
                    for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
                        opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
                        if (cblk->decoded_data) {
#ifdef DEBUG_VERBOSE
                            printf("Discarding codeblock %d,%d at resno=%d, bandno=%d\n",
                                   cblk->x0, cblk->y0, resno, bandno);
#endif
                            opj_aligned_free(cblk->decoded_data);
                            cblk->decoded_data = NULL;
                        }
                    }
                    continue;
                }

                for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
                    opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
                    opj_t1_cblk_decode_processing_job_t* job;

                    if (!opj_tcd_is_subband_area_of_interest(tcd,
                            tilec->compno,
                            resno,
                            band->bandno,
                            (OPJ_UINT32)cblk->x0,
                            (OPJ_UINT32)cblk->y0,
                            (OPJ_UINT32)cblk->x1,
                            (OPJ_UINT32)cblk->y1)) {
                        if (cblk->decoded_data) {
#ifdef DEBUG_VERBOSE
                            printf("Discarding codeblock %d,%d at resno=%d, bandno=%d\n",
                                   cblk->x0, cblk->y0, resno, bandno);
#endif
                            opj_aligned_free(cblk->decoded_data);
                            cblk->decoded_data = NULL;
                        }
                        continue;
                    }

                    if (!tcd->whole_tile_decoding) {
                        OPJ_UINT32 cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
                        OPJ_UINT32 cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);
                        if (cblk->decoded_data != NULL) {
#ifdef DEBUG_VERBOSE
                            printf("Reusing codeblock %d,%d at resno=%d, bandno=%d\n",
                                   cblk->x0, cblk->y0, resno, bandno);
#endif
                            continue;
                        }
                        if (cblk_w == 0 || cblk_h == 0) {
                            continue;
                        }
#ifdef DEBUG_VERBOSE
                        printf("Decoding codeblock %d,%d at resno=%d, bandno=%d\n",
                               cblk->x0, cblk->y0, resno, bandno);
#endif
                    }

                    job = (opj_t1_cblk_decode_processing_job_t*) opj_calloc(1,
                            sizeof(opj_t1_cblk_decode_processing_job_t));
                    if (!job) {
                        *pret = OPJ_FALSE;
                        return;
                    }
                    job->whole_tile_decoding = tcd->whole_tile_decoding;
                    job->resno = resno;
                    job->cblk = cblk;
                    job->band = band;
                    job->tilec = tilec;
                    job->tccp = tccp;
                    job->pret = pret;
                    job->p_manager_mutex = p_manager_mutex;
                    job->p_manager = p_manager;
                    job->check_pterm = check_pterm;
                    job->mustuse_cblkdatabuffer = opj_thread_pool_get_thread_count(tp) > 1;
                    opj_thread_pool_submit_job(tp, opj_t1_clbl_decode_processor, job);
#ifdef DEBUG_VERBOSE
                    codeblocks_decoded ++;
#endif
                    if (!(*pret)) {
                        return;
                    }
                } /* cblkno */
            } /* precno */
        } /* bandno */
    } /* resno */

#ifdef DEBUG_VERBOSE
    printf("Leave opj_t1_decode_cblks(). Number decoded: %d\n", codeblocks_decoded);
#endif
    return;
}